

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O1

int If_CutPerformCheck10(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  long lVar12;
  word *pwVar13;
  bool bVar14;
  bool bVar15;
  int nWords;
  word pF [16];
  word local_b8 [17];
  
  iVar2 = 1;
  if (6 < nLeaves) {
    uVar1 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar1 = 1;
    }
    if (0 < (int)uVar1) {
      memcpy(local_b8,pTruth,(ulong)uVar1 << 3);
    }
    iVar2 = nLeaves + -6;
    uVar1 = 1 << ((byte)iVar2 & 0x1f);
    uVar4 = 0;
    uVar8 = 0;
    do {
      bVar14 = true;
      if (uVar4 < 6) {
        if (iVar2 != 0x1f) {
          lVar12 = 0;
          do {
            bVar14 = (local_b8[lVar12] & ~Truth6[uVar4]) ==
                     (local_b8[lVar12] & Truth6[uVar4]) >>
                     ((byte)(1 << ((byte)uVar4 & 0x1f)) & 0x3f);
            if (!bVar14) break;
            bVar15 = (ulong)uVar1 - 1 != lVar12;
            lVar12 = lVar12 + 1;
          } while (bVar15);
        }
      }
      else if (iVar2 != 0x1f) {
        bVar3 = (byte)(uVar4 - 6);
        uVar7 = 1 << (bVar3 & 0x1f);
        iVar6 = 2 << (bVar3 & 0x1f);
        uVar11 = 1;
        if (1 < (int)uVar7) {
          uVar11 = (ulong)uVar7;
        }
        pwVar10 = local_b8 + (int)uVar7;
        iVar5 = 0;
        pwVar13 = local_b8;
        do {
          if (uVar4 - 6 != 0x1f) {
            uVar9 = 0;
            do {
              if (pwVar13[uVar9] != pwVar10[uVar9]) {
                bVar14 = false;
                goto LAB_00394b07;
              }
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          iVar5 = iVar5 + iVar6;
          pwVar10 = pwVar10 + iVar6;
          pwVar13 = pwVar13 + iVar6;
        } while (iVar5 < (int)uVar1);
      }
LAB_00394b07:
      uVar7 = 1 << ((byte)uVar4 & 0x1f);
      if (bVar14) {
        uVar7 = 0;
      }
      uVar8 = uVar8 | uVar7;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nLeaves);
    iVar2 = 0;
    if ((uVar8 != 0) && ((uVar8 + 1 & uVar8) == 0)) {
      iVar2 = If_Dec10Perform(local_b8,nLeaves,(int)uVar4);
    }
  }
  return iVar2;
}

Assistant:

int If_CutPerformCheck10( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
	int nSupp, fDerive = 0;
    word pF[16];
    if ( nLeaves <= 6 )
        return 1;
    If_Dec10Copy( pF, (word *)pTruth, nVars );
    nSupp = If_Dec10Support( pF, nLeaves );
    if ( !nSupp || !If_DecSuppIsMinBase(nSupp) )
        return 0;
    if ( If_Dec10Perform( pF, nLeaves, fDerive ) )
    {
//        printf( "1" );
        return 1;
//        If_Dec10Verify( t, nLeaves, NULL );
    }
//    printf( "0" );
    return 0;
}